

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

char * anm_get_name(anm_archive_t *archive,char *name)

{
  int iVar1;
  char *pcVar2;
  list_node_t *local_30;
  list_node_t *node;
  char *other_name;
  char *name_local;
  anm_archive_t *archive_local;
  
  local_30 = (archive->names).head;
  while( true ) {
    if (local_30 == (list_node_t *)0x0) {
      pcVar2 = strdup(name);
      list_append_new(&archive->names,pcVar2);
      return pcVar2;
    }
    pcVar2 = (char *)local_30->data;
    iVar1 = strcmp(name,pcVar2);
    if (iVar1 == 0) break;
    local_30 = local_30->next;
  }
  return pcVar2;
}

Assistant:

static char*
anm_get_name(
    anm_archive_t* archive,
    const char* name)
{
    char* other_name;
    list_for_each(&archive->names, other_name) {
        if (strcmp(name, other_name) == 0)
            return other_name;
    }

    other_name = strdup(name);
    list_append_new(&archive->names, other_name);
    return other_name;
}